

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans.c
# Opt level: O0

float64 k_means_label_subset
                  (codew_t *label,vector_t *mean,uint32 n_mean,uint32 *subset,uint32 n_obs_subset,
                  uint32 veclen)

{
  vector_t pfVar1;
  vector_t m;
  vector_t c;
  float64 sqerr;
  float64 b_d;
  float64 d;
  float64 t;
  uint32 l;
  uint32 b_j;
  uint32 j;
  uint32 i;
  uint32 veclen_local;
  uint32 n_obs_subset_local;
  uint32 *subset_local;
  uint32 n_mean_local;
  vector_t *mean_local;
  codew_t *label_local;
  
  t._4_4_ = 0;
  c = (vector_t)0x0;
  for (b_j = 0; b_j < n_obs_subset; b_j = b_j + 1) {
    sqerr = 1e+300;
    pfVar1 = (*get_obs)(subset[b_j]);
    for (l = 0; l < n_mean; l = l + 1) {
      b_d = 0.0;
      for (t._0_4_ = 0; t._0_4_ < veclen && (double)b_d < (double)sqerr; t._0_4_ = t._0_4_ + 1) {
        b_d = (float64)((double)(mean[l][t._0_4_] - pfVar1[t._0_4_]) *
                        (double)(mean[l][t._0_4_] - pfVar1[t._0_4_]) + (double)b_d);
      }
      if ((double)b_d < (double)sqerr) {
        sqerr = b_d;
        t._4_4_ = l;
      }
    }
    label[b_j] = t._4_4_;
    c = (vector_t)((double)sqerr + (double)c);
  }
  return (float64)c;
}

Assistant:

float64
k_means_label_subset(codew_t *label,
		     vector_t *mean,
		     uint32 n_mean,       /* # of mean vectors */
		     uint32 *subset,
		     uint32 n_obs_subset,   /* in # of vectors */
		     uint32 veclen)
{
    uint32 i, j, b_j=0, l;
    float64 t, d;
    float64 b_d;
    float64 sqerr;
    vector_t c;
    vector_t m;

    for (i = 0, sqerr = 0; i < n_obs_subset; i++) {
	b_d = 1e300;

	c = get_obs(subset[i]);
	
	for (j = 0; j < n_mean; j++) {
	    m = mean[j];

	    for (l = 0, d = 0.0; (l < veclen) && (d < b_d); l++) {
		t = m[l] - c[l];
		d += t * t;
	    }

	    if (d < b_d) {
		b_d = d;
		b_j = j;
	    }
	}

	label[i] = b_j;

	sqerr += b_d;
    }

    return sqerr;
}